

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O1

void __thiscall
Assimp::D3MF::OpcPackageRelationshipReader::ParseChildNode
          (OpcPackageRelationshipReader *this,XmlReader *xmlReader)

{
  char *pcVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *psVar4;
  OpcPackageRelationshipPtr relPtr;
  value_type local_38;
  
  local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)operator_new(0x60);
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->id)._M_dataplus._M_p = (pointer)0x0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->id)._M_string_length = 0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->id).field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&((local_38.
             super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->id).field_2 + 8) = 0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->type)._M_dataplus._M_p = (pointer)0x0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->type)._M_string_length = 0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->type).field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&((local_38.
             super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->type).field_2 + 8) = 0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->target)._M_dataplus._M_p = (pointer)0x0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->target)._M_string_length = 0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->target).field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&((local_38.
             super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->target).field_2 + 8) = 0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->id)._M_dataplus._M_p =
       (pointer)&((local_38.
                   super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->id).field_2;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->id)._M_string_length = 0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->id).field_2._M_local_buf[0] = '\0';
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->type)._M_dataplus._M_p =
       (pointer)&((local_38.
                   super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->type).field_2;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->type)._M_string_length = 0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->type).field_2._M_local_buf[0] = '\0';
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->target)._M_dataplus._M_p =
       (pointer)&((local_38.
                   super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->target).field_2;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->target)._M_string_length = 0;
  ((local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->target).field_2._M_local_buf[0] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Assimp::D3MF::OpcPackageRelationship*>
            (&local_38.
              super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             local_38.
             super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  iVar3 = (*xmlReader->_vptr_IIrrXMLReader[8])(xmlReader);
  peVar2 = local_38.
           super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar1 = (char *)((local_38.
                     super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->id)._M_string_length;
  strlen((char *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::string::_M_replace((ulong)peVar2,0,pcVar1,CONCAT44(extraout_var,iVar3));
  iVar3 = (*xmlReader->_vptr_IIrrXMLReader[8])(xmlReader);
  pcVar1 = (char *)((local_38.
                     super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->type)._M_string_length;
  psVar4 = &(local_38.
             super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->type;
  strlen((char *)CONCAT44(extraout_var_00,iVar3));
  std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar1,CONCAT44(extraout_var_00,iVar3));
  iVar3 = (*xmlReader->_vptr_IIrrXMLReader[8])(xmlReader);
  pcVar1 = (char *)((local_38.
                     super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->target)._M_string_length;
  psVar4 = &(local_38.
             super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->target;
  strlen((char *)CONCAT44(extraout_var_01,iVar3));
  std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar1,CONCAT44(extraout_var_01,iVar3));
  if (((((local_38.
          super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->id)._M_string_length != 0) &&
      (((local_38.
         super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->type)._M_string_length != 0)) &&
     (((local_38.
        super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->target)._M_string_length != 0)) {
    std::
    vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
    ::push_back(&this->m_relationShips,&local_38);
  }
  if (local_38.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.
               super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ParseChildNode(XmlReader* xmlReader) {        
        OpcPackageRelationshipPtr relPtr(new OpcPackageRelationship());

        relPtr->id = xmlReader->getAttributeValueSafe(XmlTag::RELS_ATTRIB_ID.c_str());
        relPtr->type = xmlReader->getAttributeValueSafe(XmlTag::RELS_ATTRIB_TYPE.c_str());
        relPtr->target = xmlReader->getAttributeValueSafe(XmlTag::RELS_ATTRIB_TARGET.c_str());
        if ( validateRels( relPtr ) ) {
            m_relationShips.push_back( relPtr );
        }
    }